

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O2

void __thiscall Kuhn::Game::step(Game *this,int action)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  int i;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  bool bVar12;
  double dVar13;
  char local_22 [2];
  undefined8 local_20;
  
  uVar6 = (ulong)(uint)action;
  if (this->mCurrentPlayer == 3) {
    this->mChanceProbability = 0.16666666666666666;
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      (this->mCards)._M_elems[lVar7] = (int)lVar7;
    }
    for (uVar8 = 3; 1 < uVar8; uVar8 = uVar8 - 1) {
      iVar4 = (this->mCards)._M_elems[uVar8 - 1];
      iVar10 = (int)uVar6;
      uVar6 = (long)iVar10 / (long)(int)uVar8 & 0xffffffff;
      iVar10 = iVar10 % (int)uVar8;
      (this->mCards)._M_elems[uVar8 - 1] = (this->mCards)._M_elems[iVar10];
      (this->mCards)._M_elems[iVar10] = iVar4;
    }
    iVar4 = (this->mCards)._M_elems[1];
    this->mInfoSets[0][0] = (uint8_t)(this->mCards)._M_elems[0];
    this->mInfoSets[1][0] = (uint8_t)iVar4;
    this->mTurnNum = 0;
    this->mCurrentPlayer = 0;
    this->mFirstBetTurn = -1;
    this->mBetPlayerNum = 0;
    this->mDone = false;
    return;
  }
  uVar1 = this->mBetPlayerNum;
  uVar2 = this->mTurnNum;
  this->mBetPlayerNum = action + uVar1;
  this->mTurnNum = uVar2 + 1;
  for (lVar7 = -0x14; lVar7 != 0; lVar7 = lVar7 + 10) {
    *(char *)((long)(this->mInfoSets + 2) + lVar7 + this->mTurnNum) = (char)action;
  }
  uVar3 = this->mTurnNum;
  uVar11 = this->mFirstBetTurn;
  if (action == 1 && this->mFirstBetTurn == 0xffffffff) {
    this->mFirstBetTurn = uVar3;
    uVar11 = uVar3;
  }
  uVar6 = (long)(int)uVar3 % 2 & 0xffffffff;
  if ((int)uVar3 < 2) goto LAB_0010fa77;
  if ((int)uVar11 < 1) {
    if (uVar11 != 0xffffffff || uVar3 != 2) goto LAB_0010f8ec;
    bVar12 = this->mInfoSets[0][2] == '\0';
LAB_0010f8ee:
    iVar4 = this->mBetPlayerNum;
    if (iVar4 != 2) {
      if (!bVar12) goto LAB_0010fa77;
      goto LAB_0010f949;
    }
LAB_0010f8f6:
    piVar5 = std::__max_element<int*,__gnu_cxx::__ops::_Iter_less_iter>
                       (&this->mCards,(this->mCards)._M_elems + 2);
    lVar7 = (long)piVar5 - (long)&this->mCards;
    *(undefined8 *)((long)this + lVar7 * 2 + 0x18) = 0x4000000000000000;
    for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
      if (lVar7 >> 2 != lVar9) {
        (this->mPayoff)._M_elems[lVar9] = -2.0;
      }
    }
  }
  else {
    if (uVar3 - uVar11 != 1) {
LAB_0010f8ec:
      bVar12 = false;
      goto LAB_0010f8ee;
    }
    iVar4 = this->mBetPlayerNum;
    if (iVar4 == 2) goto LAB_0010f8f6;
LAB_0010f949:
    if (iVar4 == 1) {
      (this->mPayoff)._M_elems[uVar6] = 1.0;
      for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
        if (uVar6 != uVar8) {
          (this->mPayoff)._M_elems[uVar8] = -1.0;
        }
      }
    }
    else if (iVar4 == 0) {
      piVar5 = std::__max_element<int*,__gnu_cxx::__ops::_Iter_less_iter>
                         (&this->mCards,(this->mCards)._M_elems + 2);
      lVar7 = (long)piVar5 - (long)&this->mCards;
      *(undefined8 *)((long)this + lVar7 * 2 + 0x18) = 0x3ff0000000000000;
      for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
        if (lVar7 >> 2 != lVar9) {
          (this->mPayoff)._M_elems[lVar9] = -1.0;
        }
      }
    }
    else {
      if (iVar4 < 2) goto LAB_0010fa77;
      local_20 = 0xffffffffffffffff;
      local_22[0] = '\0';
      local_22[1] = '\0';
      for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
        if (this->mInfoSets[0][uVar6 + 1] == '\x01') {
          uVar11 = (uint)uVar6 & 1;
          uVar8 = (ulong)(uVar11 * 4);
          *(undefined4 *)((long)&local_20 + uVar8) =
               *(undefined4 *)((long)(this->mCards)._M_elems + uVar8);
          local_22[uVar11] = '\x01';
        }
      }
      piVar5 = std::__max_element<int*,__gnu_cxx::__ops::_Iter_less_iter>
                         (&local_20,&stack0xffffffffffffffe8);
      lVar7 = (long)piVar5 - (long)&local_20;
      *(double *)((long)this + lVar7 * 2 + 0x18) = (double)this->mBetPlayerNum;
      for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
        dVar13 = -1.0;
        if ((local_22[lVar9] != '\x01') || (dVar13 = -2.0, lVar7 >> 2 != lVar9)) {
          (this->mPayoff)._M_elems[lVar9] = dVar13;
        }
      }
    }
  }
  this->mDone = true;
LAB_0010fa77:
  this->mCurrentPlayer = (int)((long)(int)uVar3 % 2);
  return;
}

Assistant:

void Game::step(const int action) {
    // chance node action
    if (mCurrentPlayer == PlayerNum + 1) {
        constexpr int ChanceAN = ChanceActionNum();
        mChanceProbability = 1.0 / double(ChanceAN);
        for (int i = 0; i < CardNum; ++i) {
            mCards[i] = i;
        }
        // shuffle cards
        int a = action;
        for (int c1 = int(mCards.size()) - 1; c1 > 0; --c1) {
            const int c2 = a % (c1 + 1);
            const int tmp = mCards[c1];
            mCards[c1] = mCards[c2];
            mCards[c2] = tmp;
            a = (int) a / (c1 + 1);
        }
        for (int i = 0; i < PlayerNum; ++i) {
            mInfoSets[i][0] = mCards[i];
        }
        mTurnNum = 0;
        mCurrentPlayer = 0;
        mFirstBetTurn = -1;
        mBetPlayerNum = 0;
        mDone = false;
        return;
    }

    // update history
    mTurnNum += 1;
    mBetPlayerNum += action;
    for (auto &infoSet : mInfoSets) {
        infoSet[mTurnNum] = action;
    }
    if (mFirstBetTurn == -1 && action == 1) {
        mFirstBetTurn = mTurnNum;
    }

    // update payoff
    const int plays = mTurnNum;
    const int player = plays % PlayerNum;
    int opponents[PlayerNum - 1];
    for (int i = 0; i < PlayerNum - 1; ++i) {
        opponents[i] = (player + i + 1) % PlayerNum;
    }
    if (plays > 1) {
        const bool terminalPass = (mFirstBetTurn > 0 && (mTurnNum - mFirstBetTurn == PlayerNum - 1)) || (mTurnNum == PlayerNum && mFirstBetTurn == -1 && mInfoSets[0][mTurnNum] == 0);
        // all bet
        if (mBetPlayerNum == PlayerNum) {
            const size_t winPlayer = std::distance(mCards.begin(), std::max_element(mCards.begin(), mCards.begin() + PlayerNum));
            mPayoff[winPlayer] = 2 * (PlayerNum - 1);
            for (int i = 0; i < PlayerNum; ++i) {
                if (i == winPlayer) {
                    continue;
                }
                mPayoff[i] = -2;
            }
            mDone = true;
        } else if (terminalPass) {
            // all fold
            if (mBetPlayerNum == 0) {
                const size_t winPlayer = std::distance(mCards.begin(), std::max_element(mCards.begin(), mCards.begin() + PlayerNum));
                mPayoff[winPlayer] = PlayerNum - 1;
                for (int i = 0; i < PlayerNum; ++i) {
                    if (i == winPlayer) {
                        continue;
                    }
                    mPayoff[i] = -1;
                }
                mDone = true;
            }
            // only one player bet
            else if (mBetPlayerNum == 1) {
                mPayoff[player] = PlayerNum - 1;
                for (int i = 0; i < PlayerNum; ++i) {
                    if (i == player) {
                        continue;
                    }
                    mPayoff[i] = -1;
                }
                mDone = true;
            }
            // more than two players bet
            else if (mBetPlayerNum >= 2) {
                std::array<int, PlayerNum> card{};
                card.fill(-1);
                std::array<bool, PlayerNum> isBet{};
                isBet.fill(false);
                for (int i = 0; i < mTurnNum; ++i) {
                    if (mInfoSets[0][i + 1] == 1) {
                        card[i % PlayerNum] = mCards[i % PlayerNum];
                        isBet[i % PlayerNum] = true;
                    }
                }
                const size_t winPlayer = std::distance(card.begin(), std::max_element(card.begin(), card.end()));
                mPayoff[winPlayer] = 2 * (mBetPlayerNum - 1) + (PlayerNum - mBetPlayerNum);
                for (int i = 0; i < PlayerNum; ++i) {
                    if (!isBet[i]) {
                        mPayoff[i] = -1;
                        continue;
                    }
                    if (i == winPlayer) {
                        continue;
                    }
                    mPayoff[i] = -2;
                }
                mDone = true;
            }
        }
    }
    mCurrentPlayer = player;
}